

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     parallel_for<Omega_h::get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::__0>
               (LO n,type *f,char *name)

{
  undefined1 local_90 [8];
  type f2;
  IntIterator last;
  IntIterator first;
  char *name_local;
  type *f_local;
  LO n_local;
  
  f2._76_4_ = 0;
  f2.nclass_ids = n;
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::__0
            ((__0 *)local_90,f);
  for_each<Omega_h::IntIterator,Omega_h::get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::__0>
            ((IntIterator)f2._76_4_,(IntIterator)f2.nclass_ids,(type *)local_90);
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
            ((__0 *)local_90);
  return;
}

Assistant:

void parallel_for(LO n, T const& f, char const* name = "") {
#if defined(OMEGA_H_USE_KOKKOS)
  if (n > 0) Kokkos::parallel_for(name, policy(n), f);
#else
  (void)name;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  auto f2 = f;
  ::Omega_h::for_each(first, last, std::move(f2));
#endif
}